

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O3

Component ftxui::Button(ConstStringRef *label,function<void_()> *on_click,
                       Ref<ftxui::ButtonOption> option)

{
  long lVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 in_R8;
  Component CVar4;
  long *local_78;
  long local_70;
  long local_68 [2];
  undefined8 local_58;
  _Any_data local_50;
  code *local_40;
  
  puVar2 = (undefined8 *)operator_new(0xa0);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_00173dd0;
  local_78 = local_68;
  lVar1 = *(long *)&(on_click->super__Function_base)._M_functor;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,lVar1,
             *(long *)((long)&(on_click->super__Function_base)._M_functor + 8) + lVar1);
  local_58 = *(undefined8 *)&on_click[1].super__Function_base._M_functor;
  std::function<void_()>::function((function<void_()> *)&local_50,option._0_8_);
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[2] = &PTR__ButtonBase_00173e20;
  puVar2[7] = puVar2 + 9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 7),local_78,local_70 + (long)local_78);
  puVar2[0xb] = local_58;
  std::function<void_()>::function
            ((function<void_()> *)(puVar2 + 0xc),(function<void_()> *)&local_50);
  puVar2[0x10] = 0;
  puVar2[0x11] = 0;
  *(char *)(puVar2 + 0x12) = (char)option.address_;
  puVar2[0x13] = in_R8;
  _Var3._M_pi = extraout_RDX;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
    _Var3._M_pi = extraout_RDX_01;
  }
  (label->owned_)._M_dataplus._M_p = (pointer)(puVar2 + 2);
  (label->owned_)._M_string_length = (size_type)puVar2;
  CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)label;
  return (Component)CVar4.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Button(ConstStringRef label,
                 std::function<void()> on_click,
                 Ref<ButtonOption> option) {
  return Make<ButtonBase>(label, std::move(on_click), std::move(option));
}